

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

void prvTidyCheckHTMLTagsAttribsVersions(TidyDocImpl *doc,Node *node)

{
  uint uVar1;
  int iVar2;
  TidyTagId TVar3;
  Dict *pDVar4;
  AttVal *pAVar5;
  uint uVar6;
  uint uVar7;
  Bool BVar8;
  Bool BVar9;
  uint code;
  AttVal *attval;
  
  uVar1 = doc->lexer->doctype;
  uVar7 = doc->lexer->versionEmitted;
  if (uVar7 == 0) {
    uVar7 = uVar1;
  }
  if (node != (Node *)0x0) {
    uVar6 = (uint)((uVar7 & 0x60124) == 0);
    iVar2 = *(int *)((doc->config).value + 0x51);
    do {
      BVar8 = prvTidynodeIsElement(node);
      if (((BVar8 != no) && (pDVar4 = node->tag, pDVar4 != (Dict *)0x0)) &&
         (*(int *)((doc->config).value + 0x67) == 0)) {
        if ((iVar2 == 0) || ((pDVar4->versions & uVar7) != 0)) {
          if (((pDVar4->versions & 0xe000) != 0) &&
             ((*(int *)((doc->config).value + 0x30) == 0 ||
              ((pDVar4->id != TidyTag_NOBR && (pDVar4->id != TidyTag_WBR)))))) {
            BVar8 = prvTidynodeIsAutonomousCustomFormat(node);
            if (((uVar1 & 0x60000) == 0) || (BVar8 == no)) {
              prvTidyReport(doc,(Node *)0x0,node,0x270);
            }
            if (node->tag != (Dict *)0x0) {
              TVar3 = node->tag->id;
              if (TVar3 == TidyTag_SPACER) {
                *(byte *)&doc->badLayout = (byte)doc->badLayout | 1;
              }
              else if (TVar3 == TidyTag_NOBR) {
                *(byte *)&doc->badLayout = (byte)doc->badLayout | 4;
              }
              else if (TVar3 == TidyTag_LAYER) {
                *(byte *)&doc->badLayout = (byte)doc->badLayout | 2;
              }
            }
          }
        }
        else {
          prvTidyReport(doc,(Node *)0x0,node,uVar6 + 0x239);
        }
      }
      BVar8 = prvTidynodeIsElement(node);
      if (BVar8 != no) {
        pAVar5 = node->attributes;
LAB_00139312:
        while (attval = pAVar5, attval != (AttVal *)0x0) {
          pAVar5 = attval->next;
          BVar8 = prvTidyAttributeIsProprietary(node,attval);
          if (iVar2 == 0) goto LAB_00139357;
          BVar9 = prvTidyAttributeIsMismatched(node,attval,doc);
          if (BVar8 != no) goto LAB_0013935c;
          code = uVar6 | 0x254;
          if (BVar9 != no) goto LAB_00139374;
        }
      }
      if (node->content != (Node *)0x0) {
        prvTidyCheckHTMLTagsAttribsVersions(doc,node->content);
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return;
LAB_00139357:
  if (BVar8 != no) {
LAB_0013935c:
    if (*(int *)((doc->config).value + 0x58) != 0) {
      code = 0x26f;
LAB_00139374:
      prvTidyReportAttrError(doc,node,attval,code);
    }
    if (*(int *)((doc->config).value + 0x11) != 0) {
      prvTidyRemoveAttribute(doc,node,attval);
    }
  }
  goto LAB_00139312;
}

Assistant:

void TY_(CheckHTMLTagsAttribsVersions)( TidyDocImpl* doc, Node* node )
{
    uint versionEmitted = doc->lexer->versionEmitted;
    uint declared = doc->lexer->doctype;
    uint version = versionEmitted == 0 ? declared : versionEmitted;
    int tagReportType = VERS_STRICT & version ? ELEMENT_VERS_MISMATCH_ERROR : ELEMENT_VERS_MISMATCH_WARN;
    int attrReportType = VERS_STRICT & version ? MISMATCHED_ATTRIBUTE_ERROR : MISMATCHED_ATTRIBUTE_WARN;
    Bool check_versions = cfgBool( doc, TidyStrictTagsAttr );
    AttVal *next_attr, *attval;
    Bool attrIsProprietary = no;
    Bool attrIsMismatched = yes;
    Bool tagLooksCustom = no;
    Bool htmlIs5 = (doc->lexer->doctype & VERS_HTML5) > 0;

    while (node)
    {
        /* This bit here handles our HTML tags */
        if ( TY_(nodeIsElement)(node) && node->tag ) {

            /* Leave XML stuff alone. */
            if ( !cfgBool(doc, TidyXmlTags) )
            {
                /* Version mismatches take priority. */
                if ( check_versions && !(node->tag->versions & version) )
                {
                    TY_(Report)(doc, NULL, node, tagReportType );
                }
                /* If it's not mismatched, it could still be proprietary. */
                else if ( node->tag->versions & VERS_PROPRIETARY )
                {
                    if ( !cfgBool(doc, TidyMakeClean) ||
                        ( !nodeIsNOBR(node) && !nodeIsWBR(node) ) )
                    {
                        /* It looks custom, despite whether it's a known tag. */
                        tagLooksCustom = TY_(nodeIsAutonomousCustomFormat)( node );

                        /* If we're in HTML5 mode and the tag does not look
                           like a valid custom tag, then issue a warning.
                           Appearance is good enough because invalid tags have
                           been dropped. Also, if we're not in HTML5 mode, then
                           then everything that reaches here gets the warning.
                           Everything else can be ignored. */

                        if ( (htmlIs5 && !tagLooksCustom) || !htmlIs5 )
                        {
                            TY_(Report)(doc, NULL, node, PROPRIETARY_ELEMENT );
                        }

                        if ( nodeIsLAYER(node) )
                            doc->badLayout |= USING_LAYER;
                        else if ( nodeIsSPACER(node) )
                            doc->badLayout |= USING_SPACER;
                        else if ( nodeIsNOBR(node) )
                            doc->badLayout |= USING_NOBR;
                    }
                }
            }
        }

        /* And this bit here handles our attributes */
        if (TY_(nodeIsElement)(node))
        {
            attval = node->attributes;

            while (attval)
            {
                next_attr = attval->next;

                attrIsProprietary = TY_(AttributeIsProprietary)(node, attval);
                attrIsMismatched = check_versions ? TY_(AttributeIsMismatched)(node, attval, doc) : no;
                /* Let the PROPRIETARY_ATTRIBUTE warning have precedence. */
                if ( attrIsProprietary )
                {
                    if ( cfgBool(doc, TidyWarnPropAttrs) )
                        TY_(ReportAttrError)(doc, node, attval, PROPRIETARY_ATTRIBUTE);
                }
                else if ( attrIsMismatched )
                {
                    TY_(ReportAttrError)(doc, node, attval, attrReportType);
                }

                /* @todo: do we need a new option to drop mismatches? Or should we
                 simply drop them? */
                if ( ( attrIsProprietary || attrIsMismatched ) && cfgBool(doc, TidyDropPropAttrs) )
                    TY_(RemoveAttribute)( doc, node, attval );

                attval = next_attr;
            }
        }

        if (node->content)
            TY_(CheckHTMLTagsAttribsVersions)( doc, node->content );
        
        node = node->next;
    }
}